

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize_tests.cpp
# Opt level: O0

void __thiscall cluster_linearize_tests::depgraph_ser_tests::test_method(depgraph_ser_tests *this)

{
  initializer_list<unsigned_int> ilist;
  initializer_list<unsigned_int> ilist_00;
  initializer_list<unsigned_int> ilist_01;
  initializer_list<unsigned_int> ilist_02;
  initializer_list<unsigned_int> ilist_03;
  initializer_list<unsigned_int> ilist_04;
  initializer_list<unsigned_int> ilist_05;
  initializer_list<unsigned_int> ilist_06;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_00;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_01;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_02;
  initializer_list<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> __l_03;
  long in_FS_OFFSET;
  undefined4 in_stack_fffffffffffff8e8;
  int32_t in_stack_fffffffffffff8ec;
  FeeFrac *in_stack_fffffffffffff8f0;
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_> *in_stack_fffffffffffff8f8;
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  *this_00;
  IntBitSet<unsigned_int> *in_stack_fffffffffffff908;
  IntBitSet<unsigned_int> *this_01;
  iterator in_stack_fffffffffffff910;
  iterator puVar1;
  size_type in_stack_fffffffffffff918;
  IntBitSet<unsigned_int> *pIVar2;
  allocator_type *in_stack_fffffffffffff920;
  allocator_type *__a;
  allocator<char> *in_stack_fffffffffffff928;
  allocator<char> *__a_00;
  iterator in_stack_fffffffffffff930;
  iterator __s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  string *in_stack_fffffffffffff970;
  string *hexenc;
  Cluster<bitset_detail::IntBitSet<unsigned_int>_> *in_stack_fffffffffffff978;
  Cluster<bitset_detail::IntBitSet<unsigned_int>_> *cluster;
  undefined1 local_44e [10];
  undefined1 local_444 [8];
  IntBitSet<unsigned_int> local_43c [8];
  allocator<char> local_41a [44];
  allocator<char> local_3ee [44];
  allocator<char> local_3c2 [36];
  allocator<char> local_39e [37];
  allocator<char> local_379;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined8 local_368;
  undefined4 local_35c;
  string local_358;
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_> local_330 [2];
  undefined4 local_2fc;
  undefined4 local_2e4;
  undefined4 local_2bc;
  undefined4 local_274;
  undefined4 local_220;
  undefined4 local_21c;
  uint local_200 [6];
  allocator<char> local_1e8 [232];
  undefined4 local_100;
  undefined4 local_fc;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_378 = 0;
  uStack_370 = 0;
  local_368 = 0;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator(&local_379);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff8f8);
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __l._M_len = (size_type)in_stack_fffffffffffff938;
  __l._M_array = in_stack_fffffffffffff930;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)in_stack_fffffffffffff928,__l,in_stack_fffffffffffff920);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator(local_39e);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff8f8);
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::~allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_274 = 0;
  ilist._M_len = in_stack_fffffffffffff918;
  ilist._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(in_stack_fffffffffffff908,ilist);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __l_00._M_len = (size_type)in_stack_fffffffffffff938;
  __l_00._M_array = in_stack_fffffffffffff930;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)in_stack_fffffffffffff928,__l_00,in_stack_fffffffffffff920);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator(local_3c2);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff8f8);
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::~allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_100 = 0;
  local_fc = 1;
  ilist_00._M_len = in_stack_fffffffffffff918;
  ilist_00._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(in_stack_fffffffffffff908,ilist_00);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __l_01._M_len = (size_type)in_stack_fffffffffffff938;
  __l_01._M_array = in_stack_fffffffffffff930;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)in_stack_fffffffffffff928,__l_01,in_stack_fffffffffffff920);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator(local_3ee);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff8f8);
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::~allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_2bc = 1;
  ilist_01._M_len = in_stack_fffffffffffff918;
  ilist_01._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(in_stack_fffffffffffff908,ilist_01);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_2e4 = 1;
  ilist_02._M_len = in_stack_fffffffffffff918;
  ilist_02._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(in_stack_fffffffffffff908,ilist_02);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_2fc = 2;
  ilist_03._M_len = in_stack_fffffffffffff918;
  ilist_03._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(in_stack_fffffffffffff908,ilist_03);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __l_02._M_len = (size_type)in_stack_fffffffffffff938;
  __l_02._M_array = in_stack_fffffffffffff930;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)in_stack_fffffffffffff928,__l_02,in_stack_fffffffffffff920);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff938,(char *)in_stack_fffffffffffff930,in_stack_fffffffffffff928);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>
            (in_stack_fffffffffffff978,in_stack_fffffffffffff970);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator(local_41a);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)in_stack_fffffffffffff8f8);
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::~allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_220 = 1;
  local_21c = 2;
  this_01 = local_43c;
  ilist_04._M_len = in_stack_fffffffffffff918;
  ilist_04._M_array = in_stack_fffffffffffff910;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(this_01,ilist_04);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  puVar1 = local_200;
  pIVar2 = &local_330[0].second;
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  __a = (allocator_type *)(local_444 + 4);
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __a_00 = local_1e8;
  __s = local_330;
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_444;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet
            ((IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_358.field_2._M_allocated_capacity._4_4_ = 0;
  ilist_05._M_len = (size_type)pIVar2;
  ilist_05._M_array = puVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(this_01,ilist_05);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  hexenc = &local_358;
  FeeFrac::FeeFrac(&in_stack_fffffffffffff8f8->first,(int64_t)in_stack_fffffffffffff8f0,
                   in_stack_fffffffffffff8ec);
  local_35c = 1;
  cluster = (Cluster<bitset_detail::IntBitSet<unsigned_int>_> *)(local_44e + 2);
  ilist_06._M_len = (size_type)pIVar2;
  ilist_06._M_array = puVar1;
  bitset_detail::IntBitSet<unsigned_int>::IntBitSet(this_01,ilist_06);
  std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>::
  pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>,_true>
            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
             (IntBitSet<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  __l_03._M_len = (size_type)this_02;
  __l_03._M_array = __s;
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::vector((vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
            *)__a_00,__l_03,__a);
  this_00 = (vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
             *)local_44e;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a_00);
  cluster_linearize_tests::(anonymous_namespace)::
  TestDepGraphSerialization<bitset_detail::IntBitSet<unsigned_int>>(cluster,hexenc);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  std::allocator<char>::~allocator((allocator<char> *)local_44e);
  std::
  vector<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>,_std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>_>
  ::~vector(this_00);
  std::allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_>::~allocator
            ((allocator<std::pair<FeeFrac,_bitset_detail::IntBitSet<unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffff8ec,in_stack_fffffffffffff8e8));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(depgraph_ser_tests)
{
    // Empty cluster.
    TestDepGraphSerialization<TestBitSet>(
        {},
        "00" /* end of graph */);

    // Transactions: A(fee=0,size=1).
    TestDepGraphSerialization<TestBitSet>(
        {{{0, 1}, {}}},
        "01" /* A size */
        "00" /* A fee */
        "00" /* A insertion position (no skips): A */
        "00" /* end of graph */);

    // Transactions: A(fee=42,size=11), B(fee=-13,size=7), B depends on A.
    TestDepGraphSerialization<TestBitSet>(
        {{{42, 11}, {}}, {{-13, 7}, {0}}},
        "0b" /* A size */
        "54" /* A fee */
        "00" /* A insertion position (no skips): A */
        "07" /* B size */
        "19" /* B fee */
        "00" /* B->A dependency (no skips) */
        "00" /* B insertion position (no skips): A,B */
        "00" /* end of graph */);

    // Transactions: A(64,128), B(128,256), C(1,1), C depends on A and B.
    TestDepGraphSerialization<TestBitSet>(
        {{{64, 128}, {}}, {{128, 256}, {}}, {{1, 1}, {0, 1}}},
        "8000" /* A size */
        "8000" /* A fee */
        "00"   /* A insertion position (no skips): A */
        "8100" /* B size */
        "8100" /* B fee */
        "01"   /* B insertion position (skip B->A dependency): A,B */
        "01"   /* C size */
        "02"   /* C fee */
        "00"   /* C->B dependency (no skips) */
        "00"   /* C->A dependency (no skips) */
        "00"   /* C insertion position (no skips): A,B,C */
        "00"   /* end of graph */);

    // Transactions: A(-57,113), B(57,114), C(-58,115), D(58,116). Deps: B->A, C->A, D->C, in order
    // [B,A,C,D]. This exercises non-topological ordering (internally serialized as A,B,C,D).
    TestDepGraphSerialization<TestBitSet>(
        {{{57, 114}, {1}}, {{-57, 113}, {}}, {{-58, 115}, {1}}, {{58, 116}, {2}}},
        "71" /* A size */
        "71" /* A fee */
        "00" /* A insertion position (no skips): A */
        "72" /* B size */
        "72" /* B fee */
        "00" /* B->A dependency (no skips) */
        "01" /* B insertion position (skip A): B,A */
        "73" /* C size */
        "73" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): B,A,C */
        "74" /* D size */
        "74" /* D fee */
        "00" /* D->C dependency (no skips) */
        "01" /* D insertion position (skip D->B dependency, D->A is implied): B,A,C,D */
        "00" /* end of graph */);

    // Transactions: A(1,2), B(3,1), C(2,1), D(1,3), E(1,1). Deps: C->A, D->A, D->B, E->D.
    // In order: [D,A,B,E,C]. Internally serialized in order A,B,C,D,E.
    TestDepGraphSerialization<TestBitSet>(
        {{{1, 3}, {1, 2}}, {{1, 2}, {}}, {{3, 1}, {}}, {{1, 1}, {0}}, {{2, 1}, {1}}},
        "02" /* A size */
        "02" /* A fee */
        "00" /* A insertion position (no skips): A */
        "01" /* B size */
        "06" /* B fee */
        "01" /* B insertion position (skip B->A dependency): A,B */
        "01" /* C size */
        "04" /* C fee */
        "01" /* C->A dependency (skip C->B dependency) */
        "00" /* C insertion position (no skips): A,B,C */
        "03" /* D size */
        "02" /* D fee */
        "01" /* D->B dependency (skip D->C dependency) */
        "00" /* D->A dependency (no skips) */
        "03" /* D insertion position (skip C,B,A): D,A,B,C */
        "01" /* E size */
        "02" /* E fee */
        "00" /* E->D dependency (no skips) */
        "02" /* E insertion position (skip E->C dependency, E->B and E->A are implied,
                skip insertion C): D,A,B,E,C */
        "00" /* end of graph */
    );
}